

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Allocate(SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,int **ppBuckets,EntryType **ppEntries,WeakType **ppWeakRefs,uint bucketCount,
          int size)

{
  code *pcVar1;
  bool bVar2;
  int *__s;
  undefined4 *puVar3;
  EntryType *pEVar4;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *pRVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 zeroAllocate;
  
  __s = AllocateBuckets(this,bucketCount);
  zeroAllocate = extraout_DL;
  if (__s == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x2e3,"(newBuckets)","newBuckets");
    if (!bVar2) goto LAB_00bf4a80;
    *puVar3 = 0;
    zeroAllocate = extraout_DL_00;
  }
  pEVar4 = AllocateEntries((SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                            *)this->alloc,size,(bool)zeroAllocate);
  if (pEVar4 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x2e6,"(newEntries)","newEntries");
    if (!bVar2) {
LAB_00bf4a80:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pRVar5 = Memory::Recycler::CreateWeakReferenceRegion<Js::JavascriptSymbol*>
                     (this->alloc,(long)size);
  memset(__s,0xff,(ulong)bucketCount << 2);
  *ppBuckets = __s;
  *ppEntries = pEVar4;
  *ppWeakRefs = pRVar5;
  return;
}

Assistant:

void Allocate(__deref_out_ecount(bucketCount) int** ppBuckets, __deref_out_ecount(size) EntryType** ppEntries, __deref_out_ecount(size) WeakType** ppWeakRefs, DECLSPEC_GUARD_OVERFLOW uint bucketCount, DECLSPEC_GUARD_OVERFLOW int size)
        {
            int *const newBuckets = AllocateBuckets(bucketCount);
            Assert(newBuckets); // no-throw allocators are currently not supported

            EntryType *newEntries = AllocateEntries(size);
            Assert(newEntries); // no-throw allocators are currently not supported

            WeakType * newWeakRefs = AllocateWeakRefs(size);

            memset(newBuckets, -1, bucketCount * sizeof(newBuckets[0]));

            *ppBuckets = newBuckets;
            *ppEntries = newEntries;
            *ppWeakRefs = newWeakRefs;
        }